

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

void Gia_ManAreDeriveCexSatStart(Gia_ManAre_t *p)

{
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  void *pvVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  
  if (p->pSat == (void *)0x0) {
    p_00 = Gia_ManToAig(p->pAig,0);
    Aig_ManSetRegNum(p_00,0);
    p_01 = Cnf_Derive(p_00,p->pAig->vCos->nSize);
    pvVar1 = Cnf_DataWriteIntoSolver(p_01,1,0);
    p->pSat = pvVar1;
    pVVar2 = Cnf_DataCollectCiSatNums(p_01,p_00);
    p->vSatNumCis = pVVar2;
    pVVar2 = Cnf_DataCollectCoSatNums(p_01,p_00);
    p->vSatNumCos = pVVar2;
    Cnf_DataFree(p_01);
    Aig_ManStop(p_00);
    pVVar2 = (Vec_Int_t *)malloc(0x10);
    pVVar2->nCap = 100;
    pVVar2->nSize = 0;
    piVar3 = (int *)malloc(400);
    pVVar2->pArray = piVar3;
    p->vAssumps = pVVar2;
    pVVar2 = (Vec_Int_t *)malloc(0x10);
    pVVar2->nCap = 100;
    pVVar2->nSize = 0;
    piVar3 = (int *)malloc(400);
    pVVar2->pArray = piVar3;
    p->vCofVars = pVVar2;
    return;
  }
  __assert_fail("p->pSat == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                ,0x70b,"void Gia_ManAreDeriveCexSatStart(Gia_ManAre_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManAreDeriveCexSatStart( Gia_ManAre_t * p )
{
    Aig_Man_t * pAig2;
    Cnf_Dat_t * pCnf;
    assert( p->pSat == NULL );
    pAig2 = Gia_ManToAig( p->pAig, 0 );
    Aig_ManSetRegNum( pAig2, 0 );
    pCnf = Cnf_Derive( pAig2, Gia_ManCoNum(p->pAig) );
    p->pSat = Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    p->vSatNumCis = Cnf_DataCollectCiSatNums( pCnf, pAig2 );
    p->vSatNumCos = Cnf_DataCollectCoSatNums( pCnf, pAig2 );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pAig2 );
    p->vAssumps = Vec_IntAlloc( 100 );
    p->vCofVars = Vec_IntAlloc( 100 );
}